

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ec_commit_api(void)

{
  int iVar1;
  secp256k1_ge pubkey_tmp;
  secp256k1_sha256 sha;
  uchar data [32];
  secp256k1_ge commitment;
  secp256k1_gej pubkeyj;
  secp256k1_ge pubkey;
  secp256k1_scalar seckey_s;
  uchar seckey [32];
  secp256k1_ge *in_stack_fffffffffffffd58;
  secp256k1_ge *in_stack_fffffffffffffd60;
  secp256k1_scalar *in_stack_fffffffffffffd80;
  uchar *in_stack_fffffffffffffd88;
  secp256k1_sha256 *in_stack_fffffffffffffd90;
  secp256k1_ge *in_stack_fffffffffffffd98;
  secp256k1_ge *in_stack_fffffffffffffda0;
  secp256k1_gej *in_stack_fffffffffffffdb8;
  secp256k1_ge *in_stack_fffffffffffffdc0;
  undefined1 local_1d8 [24];
  secp256k1_scalar *in_stack_fffffffffffffe40;
  secp256k1_gej *in_stack_fffffffffffffe48;
  secp256k1_ecmult_gen_context *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  uchar *in_stack_fffffffffffffe60;
  secp256k1_sha256 *in_stack_fffffffffffffe68;
  secp256k1_ge *in_stack_fffffffffffffe70;
  secp256k1_ge *in_stack_fffffffffffffe78;
  undefined1 local_b0 [176];
  
  memset(local_1d8,0x17,0x20);
  random_scalar_order_test(in_stack_fffffffffffffd80);
  secp256k1_scalar_get_b32
            ((uchar *)in_stack_fffffffffffffd60,(secp256k1_scalar *)in_stack_fffffffffffffd58);
  secp256k1_ecmult_gen
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  secp256k1_ge_set_gej(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  secp256k1_sha256_initialize((secp256k1_sha256 *)&stack0xfffffffffffffdc0);
  iVar1 = secp256k1_ec_commit(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                              in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                              (size_t)in_stack_fffffffffffffd80);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1092,
            "test condition failed: secp256k1_ec_commit(&commitment, &pubkey, &sha, data, 1) == 1");
    abort();
  }
  memcpy(&stack0xfffffffffffffd58,local_b0,0x68);
  secp256k1_sha256_initialize((secp256k1_sha256 *)&stack0xfffffffffffffdc0);
  iVar1 = secp256k1_ec_commit(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                              in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                              (size_t)in_stack_fffffffffffffd80);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1097,
            "test condition failed: secp256k1_ec_commit(&pubkey_tmp, &pubkey_tmp, &sha, data, 1) == 1"
           );
    abort();
  }
  ge_equals_ge(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  secp256k1_sha256_initialize((secp256k1_sha256 *)&stack0xfffffffffffffdc0);
  iVar1 = secp256k1_ec_commit_verify
                    (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                     in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x109c,
            "test condition failed: secp256k1_ec_commit_verify(&commitment, &pubkey, &sha, data, 1) == 1"
           );
    abort();
  }
  return;
}

Assistant:

static void test_ec_commit_api(void) {
    unsigned char seckey[32];
    secp256k1_scalar seckey_s;
    secp256k1_ge pubkey;
    secp256k1_gej pubkeyj;
    secp256k1_ge commitment;
    unsigned char data[32];
    secp256k1_sha256 sha;

    memset(data, 23, sizeof(data));

    /* Create random keypair */
    random_scalar_order_test(&seckey_s);
    secp256k1_scalar_get_b32(seckey, &seckey_s);
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &pubkeyj, &seckey_s);
    secp256k1_ge_set_gej(&pubkey, &pubkeyj);

    secp256k1_sha256_initialize(&sha);
    CHECK(secp256k1_ec_commit(&commitment, &pubkey, &sha, data, 1) == 1);
    /* The same pubkey can be both input and output of the function */
    {
        secp256k1_ge pubkey_tmp = pubkey;
        secp256k1_sha256_initialize(&sha);
        CHECK(secp256k1_ec_commit(&pubkey_tmp, &pubkey_tmp, &sha, data, 1) == 1);
        ge_equals_ge(&commitment, &pubkey_tmp);
    }

    secp256k1_sha256_initialize(&sha);
    CHECK(secp256k1_ec_commit_verify(&commitment, &pubkey, &sha, data, 1) == 1);
}